

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

DdNode * Cudd_CubeArrayToBdd(DdManager *dd,int *array)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *f;
  
  uVar3 = Cudd_ReadSize(dd);
  pDVar4 = dd->one;
  uVar5 = (ulong)pDVar4 & 0xfffffffffffffffe;
  *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
  if (0 < (int)uVar3) {
    f = pDVar4;
    uVar5 = (ulong)uVar3;
    do {
      pDVar4 = f;
      if ((uint)array[uVar5 - 1] < 2) {
        pDVar4 = Cudd_bddIthVar(dd,(int)uVar5 + -1);
        pDVar4 = Cudd_bddAnd(dd,f,(DdNode *)((ulong)(array[uVar5 - 1] == 0) ^ (ulong)pDVar4));
        if (pDVar4 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,f);
          return (DdNode *)0x0;
        }
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,f);
      }
      bVar2 = 1 < uVar5;
      f = pDVar4;
      uVar5 = uVar5 - 1;
    } while (bVar2);
    uVar5 = (ulong)pDVar4 & 0xfffffffffffffffe;
  }
  *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + -1;
  return pDVar4;
}

Assistant:

DdNode *
Cudd_CubeArrayToBdd(
  DdManager *dd,
  int *array)
{
    DdNode *cube, *var, *tmp;
    int i;
    int size = Cudd_ReadSize(dd);

    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = size - 1; i >= 0; i--) {
        if ((array[i] & ~1) == 0) {
            var = Cudd_bddIthVar(dd,i);
            tmp = Cudd_bddAnd(dd,cube,Cudd_NotCond(var,array[i]==0));
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,cube);
                return(NULL);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,cube);
            cube = tmp;
        }
    }
    cuddDeref(cube);
    return(cube);

}